

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::SubSurfaceMaterial::SubSurfaceMaterial(SubSurfaceMaterial *this,string *name)

{
  string *in_RDI;
  Material *unaff_retaddr;
  
  Material::Material(unaff_retaddr,in_RDI);
  *(undefined ***)in_RDI = &PTR_toString_abi_cxx11__00220620;
  *(undefined4 *)((long)&in_RDI[1].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[1].field_2 + 0xc) = 0;
  in_RDI[2]._M_dataplus = (_Alloc_hider)0x1;
  std::__cxx11::string::string((string *)&in_RDI[2]._M_string_length);
  return;
}

Assistant:

SubSurfaceMaterial(const std::string &name = "") : Material(name) {}